

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O0

string * llama_model_ftype_name_abi_cxx11_(llama_ftype ftype)

{
  uint in_ESI;
  string *in_RDI;
  char *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  allocator<char> *in_stack_fffffffffffffeb0;
  allocator<char> *paVar1;
  char *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_5d;
  allocator<char> local_5c;
  allocator<char> local_5b;
  allocator<char> local_5a;
  allocator<char> local_59;
  allocator<char> local_58;
  allocator<char> local_57;
  allocator<char> local_56;
  allocator<char> local_55;
  undefined1 local_54 [2];
  allocator<char> local_52;
  allocator<char> local_51;
  allocator<char> local_50;
  allocator<char> local_4f;
  allocator<char> local_4e;
  allocator<char> local_4d;
  allocator<char> local_4c;
  allocator<char> local_4b;
  allocator<char> local_4a;
  allocator<char> local_49;
  allocator<char> local_48;
  allocator<char> local_47;
  allocator<char> local_46;
  allocator<char> local_45;
  allocator<char> local_44;
  allocator<char> local_43;
  allocator<char> local_42;
  allocator<char> local_41;
  allocator<char> local_40;
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d [13];
  string local_30 [28];
  llama_ftype in_stack_ffffffffffffffec;
  
  if ((in_ESI & 0x400) == 0) {
    switch(in_ESI) {
    case 0:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::allocator<char>::~allocator(local_3d);
      break;
    case 1:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::allocator<char>::~allocator(&local_3e);
      break;
    case 2:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::allocator<char>::~allocator(&local_40);
      break;
    case 3:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::allocator<char>::~allocator(&local_41);
      break;
    default:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::allocator<char>::~allocator(&local_5d);
      break;
    case 7:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::allocator<char>::~allocator(&local_44);
      break;
    case 8:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::allocator<char>::~allocator(&local_42);
      break;
    case 9:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::allocator<char>::~allocator(&local_43);
      break;
    case 10:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::allocator<char>::~allocator(&local_45);
      break;
    case 0xb:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::allocator<char>::~allocator(&local_47);
      break;
    case 0xc:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::allocator<char>::~allocator(&local_48);
      break;
    case 0xd:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::allocator<char>::~allocator(&local_49);
      break;
    case 0xe:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::allocator<char>::~allocator(&local_4a);
      break;
    case 0xf:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::allocator<char>::~allocator(&local_4b);
      break;
    case 0x10:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::allocator<char>::~allocator(&local_4c);
      break;
    case 0x11:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::allocator<char>::~allocator(&local_4d);
      break;
    case 0x12:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::allocator<char>::~allocator(&local_4e);
      break;
    case 0x13:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::allocator<char>::~allocator(&local_51);
      break;
    case 0x14:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::allocator<char>::~allocator(&local_52);
      break;
    case 0x15:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::allocator<char>::~allocator(&local_46);
      break;
    case 0x16:
      paVar1 = &local_55;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,(char *)paVar1,in_stack_fffffffffffffeb0);
      std::allocator<char>::~allocator(&local_55);
      break;
    case 0x17:
      paVar1 = &local_56;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,paVar1);
      std::allocator<char>::~allocator(&local_56);
      break;
    case 0x18:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::allocator<char>::~allocator(&local_57);
      break;
    case 0x19:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::allocator<char>::~allocator(&local_59);
      break;
    case 0x1a:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::allocator<char>::~allocator(&local_5b);
      break;
    case 0x1b:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::allocator<char>::~allocator(&local_5c);
      break;
    case 0x1c:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::allocator<char>::~allocator((allocator<char> *)(local_54 + 1));
      break;
    case 0x1d:
      this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_54;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::allocator<char>::~allocator((allocator<char> *)local_54);
      break;
    case 0x1e:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::allocator<char>::~allocator(&local_5a);
      break;
    case 0x1f:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::allocator<char>::~allocator(&local_58);
      break;
    case 0x20:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::allocator<char>::~allocator(&local_3f);
      break;
    case 0x24:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::allocator<char>::~allocator(&local_4f);
      break;
    case 0x25:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::allocator<char>::~allocator(&local_50);
    }
  }
  else {
    llama_model_ftype_name_abi_cxx11_(in_stack_ffffffffffffffec);
    std::operator+(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
    std::__cxx11::string::~string(local_30);
  }
  return in_RDI;
}

Assistant:

static std::string llama_model_ftype_name(llama_ftype ftype) {
    if (ftype & LLAMA_FTYPE_GUESSED) {
        return llama_model_ftype_name((enum llama_ftype) (ftype & ~LLAMA_FTYPE_GUESSED)) + " (guessed)";
    }

    switch (ftype) {
        case LLAMA_FTYPE_ALL_F32:         return "all F32";
        case LLAMA_FTYPE_MOSTLY_F16:      return "F16";
        case LLAMA_FTYPE_MOSTLY_BF16:     return "BF16";
        case LLAMA_FTYPE_MOSTLY_Q4_0:     return "Q4_0";
        case LLAMA_FTYPE_MOSTLY_Q4_1:     return "Q4_1";
        case LLAMA_FTYPE_MOSTLY_Q5_0:     return "Q5_0";
        case LLAMA_FTYPE_MOSTLY_Q5_1:     return "Q5_1";
        case LLAMA_FTYPE_MOSTLY_Q8_0:     return "Q8_0";
        case LLAMA_FTYPE_MOSTLY_Q2_K:     return "Q2_K - Medium";
        case LLAMA_FTYPE_MOSTLY_Q2_K_S:   return "Q2_K - Small";
        case LLAMA_FTYPE_MOSTLY_Q3_K_S:   return "Q3_K - Small";
        case LLAMA_FTYPE_MOSTLY_Q3_K_M:   return "Q3_K - Medium";
        case LLAMA_FTYPE_MOSTLY_Q3_K_L:   return "Q3_K - Large";
        case LLAMA_FTYPE_MOSTLY_Q4_K_S:   return "Q4_K - Small";
        case LLAMA_FTYPE_MOSTLY_Q4_K_M:   return "Q4_K - Medium";
        case LLAMA_FTYPE_MOSTLY_Q5_K_S:   return "Q5_K - Small";
        case LLAMA_FTYPE_MOSTLY_Q5_K_M:   return "Q5_K - Medium";
        case LLAMA_FTYPE_MOSTLY_Q6_K:     return "Q6_K";
        case LLAMA_FTYPE_MOSTLY_TQ1_0:    return "TQ1_0 - 1.69 bpw ternary";
        case LLAMA_FTYPE_MOSTLY_TQ2_0:    return "TQ2_0 - 2.06 bpw ternary";
        case LLAMA_FTYPE_MOSTLY_IQ2_XXS:  return "IQ2_XXS - 2.0625 bpw";
        case LLAMA_FTYPE_MOSTLY_IQ2_XS:   return "IQ2_XS - 2.3125 bpw";
        case LLAMA_FTYPE_MOSTLY_IQ2_S:    return "IQ2_S - 2.5 bpw";
        case LLAMA_FTYPE_MOSTLY_IQ2_M:    return "IQ2_M - 2.7 bpw";
        case LLAMA_FTYPE_MOSTLY_IQ3_XS:   return "IQ3_XS - 3.3 bpw";
        case LLAMA_FTYPE_MOSTLY_IQ3_XXS:  return "IQ3_XXS - 3.0625 bpw";
        case LLAMA_FTYPE_MOSTLY_IQ1_S:    return "IQ1_S - 1.5625 bpw";
        case LLAMA_FTYPE_MOSTLY_IQ1_M:    return "IQ1_M - 1.75 bpw";
        case LLAMA_FTYPE_MOSTLY_IQ4_NL:   return "IQ4_NL - 4.5 bpw";
        case LLAMA_FTYPE_MOSTLY_IQ4_XS:   return "IQ4_XS - 4.25 bpw";
        case LLAMA_FTYPE_MOSTLY_IQ3_S:    return "IQ3_S - 3.4375 bpw";
        case LLAMA_FTYPE_MOSTLY_IQ3_M:    return "IQ3_S mix - 3.66 bpw";

        default: return "unknown, may not work";
    }
}